

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

size_t __thiscall clickhouse::BufferOutput::DoNext(BufferOutput *this,void **data,size_t len)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_t sVar1;
  size_type __new_size;
  
  __new_size = this->pos_ + len;
  this_00 = this->buf_;
  if ((ulong)((long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
  }
  sVar1 = this->pos_;
  *data = (this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start + sVar1;
  this->pos_ = sVar1 + len;
  return len;
}

Assistant:

size_t BufferOutput::DoNext(void** data, size_t len) {
    if (pos_ + len > buf_->size()) {
        buf_->resize(pos_ + len);
    }

    *data = buf_->data() + pos_;
    pos_ += len;

    return len;
}